

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O1

Cnf_Dat_t * Cnf_DataDup(Cnf_Dat_t *p)

{
  int iVar1;
  int **ppiVar2;
  int *piVar3;
  Cnf_Dat_t *pCVar4;
  long lVar5;
  
  pCVar4 = Cnf_DataAlloc(p->pMan,p->nVars,p->nClauses,p->nLiterals);
  ppiVar2 = pCVar4->pClauses;
  memcpy(*ppiVar2,*p->pClauses,(long)p->nLiterals << 2);
  memcpy(pCVar4->pVarNums,p->pVarNums,(long)p->pMan->vObjs->nSize << 2);
  iVar1 = p->nClauses;
  if (1 < (long)iVar1) {
    piVar3 = *ppiVar2;
    lVar5 = 1;
    do {
      ppiVar2[lVar5] = (int *)(((long)p->pClauses[lVar5] - (long)*p->pClauses) + (long)piVar3);
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  return pCVar4;
}

Assistant:

Cnf_Dat_t * Cnf_DataDup( Cnf_Dat_t * p )
{
    Cnf_Dat_t * pCnf;
    int i;
    pCnf = Cnf_DataAlloc( p->pMan, p->nVars, p->nClauses, p->nLiterals );
    memcpy( pCnf->pClauses[0], p->pClauses[0], sizeof(int) * p->nLiterals );
    memcpy( pCnf->pVarNums, p->pVarNums, sizeof(int) * Aig_ManObjNumMax(p->pMan) );
    for ( i = 1; i < p->nClauses; i++ )
        pCnf->pClauses[i] = pCnf->pClauses[0] + (p->pClauses[i] - p->pClauses[0]);
    return pCnf;
}